

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O1

const_iterator __thiscall
frozen::
unordered_set<frozen::basic_string<char>,128ul,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
::
find<frozen::basic_string<char>,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
          (unordered_set<frozen::basic_string<char>,128ul,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
           *this,basic_string<char> *key,elsa<frozen::basic_string<char>_> *hash,
          equal_to<frozen::basic_string<char>_> *equal)

{
  bool bVar1;
  size_t sVar2;
  
  sVar2 = bits::pmh_tables<128ul,frozen::elsa<frozen::basic_string<char>>>::
          lookup<frozen::basic_string<char>,frozen::elsa<frozen::basic_string<char>>>
                    ((pmh_tables<128ul,frozen::elsa<frozen::basic_string<char>>> *)(this + 0x800),
                     key,hash);
  if (sVar2 != 0x80) {
    bVar1 = std::equal_to<frozen::basic_string<char>_>::operator()
                      (equal,(basic_string<char> *)(this + sVar2 * 0x10),key);
    if (bVar1) {
      return (basic_string<char> *)(this + sVar2 * 0x10);
    }
  }
  return (const_iterator)(this + 0x800);
}

Assistant:

constexpr const_iterator find(KeyType const &key, Hasher const &hash, Equal const &equal) const {
    auto const pos = tables_.lookup(key, hash);
    auto it = keys_.begin() + pos;
    if (it != keys_.end() && equal(*it, key))
      return it;
    else
      return keys_.end();
  }